

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockStrictOrderTest.cpp
# Opt level: O2

void __thiscall
TEST_MockStrictOrderTest_orderViolatedWorksWithExtraUnexpectedCall_Test::
TEST_MockStrictOrderTest_orderViolatedWorksWithExtraUnexpectedCall_Test
          (TEST_MockStrictOrderTest_orderViolatedWorksWithExtraUnexpectedCall_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMockStrictOrderTest).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  TEST_GROUP_CppUTestGroupMockStrictOrderTest::TEST_GROUP_CppUTestGroupMockStrictOrderTest
            (&this->super_TEST_GROUP_CppUTestGroupMockStrictOrderTest);
  (this->super_TEST_GROUP_CppUTestGroupMockStrictOrderTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_002ecbb0;
  return;
}

Assistant:

TEST(MockStrictOrderTest, orderViolatedWorksWithExtraUnexpectedCall)
{
    MockFailureReporterInstaller failureReporterInstaller;
    mock().strictOrder();
    mock("bla").strictOrder();
	mock().ignoreOtherCalls();

    MockExpectedCallsListForTest expectations;
    expectations.addFunctionOrdered("foo::foo1", 1)->callWasMade(2);
    expectations.addFunctionOrdered("foo::foo2", 2)->callWasMade(1);
    MockCallOrderFailure expectedFailure(mockFailureTest(), expectations);

    mock("bla").expectOneCall("foo1");
    mock("foo").expectOneCall("foo1");
    mock("foo").expectOneCall("foo2");

    mock("bla").actualCall("foo1");
    mock("foo").actualCall("foo2");
	mock("foo").actualCall("unexpected1");
    mock("foo").actualCall("foo1");
	mock("foo").actualCall("unexpected2");

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}